

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::SingularVarBigint<int,unsigned_char,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  ParseContext *ctx_00;
  ushort *puVar6;
  ulong uVar7;
  char *pcVar8;
  Spill spill;
  
  uVar7 = (ulong)*ptr;
  if (-1 < (long)uVar7) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x31c);
  }
  ctx_00 = (ParseContext *)0xffffffffffffff80;
  uVar3 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar3 < 0) {
    aVar5.data = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)aVar5 < 0) {
      pcVar8 = (char *)((long)ptr[3] << 0x15 | 0x1fffff);
      uVar3 = uVar3 & (ulong)pcVar8;
      if ((long)uVar3 < 0) {
        pcVar8 = (char *)((long)ptr[4] << 0x1c | 0xfffffff);
        aVar5.data = aVar5.data & (ulong)pcVar8;
        if ((long)aVar5.data < 0) {
          pcVar8 = (char *)((long)ptr[5] << 0x23 | 0x7ffffffff);
          uVar3 = uVar3 & (ulong)pcVar8;
          if ((long)uVar3 < 0) {
            pcVar8 = (char *)((long)ptr[6] << 0x2a | 0x3ffffffffff);
            aVar5.data = aVar5.data & (ulong)pcVar8;
            if ((long)aVar5 < 0) {
              pcVar8 = (char *)((long)ptr[7] << 0x31 | 0x1ffffffffffff);
              uVar3 = uVar3 & (ulong)pcVar8;
              if ((long)uVar3 < 0) {
                pcVar8 = (char *)((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                aVar5.data = aVar5.data & (ulong)pcVar8;
                if ((long)aVar5 < 0) {
                  bVar1 = ptr[9];
                  ctx_00 = (ParseContext *)CONCAT71(0xffffffffffffff,bVar1);
                  puVar6 = (ushort *)(ptr + 10);
                  ptr = pcVar8;
                  if (bVar1 != 1) {
                    if ((char)bVar1 < '\0') {
                      puVar6 = (ushort *)0x0;
                      goto LAB_00159500;
                    }
                    if ((bVar1 & 1) == 0) {
                      aVar5.data = aVar5.data ^ 0x8000000000000000;
                    }
                  }
                }
                else {
                  puVar6 = (ushort *)(ptr + 9);
                  ptr = pcVar8;
                }
              }
              else {
                puVar6 = (ushort *)(ptr + 8);
                ptr = pcVar8;
              }
            }
            else {
              puVar6 = (ushort *)(ptr + 7);
              ptr = pcVar8;
            }
          }
          else {
            puVar6 = (ushort *)(ptr + 6);
            ptr = pcVar8;
          }
        }
        else {
          puVar6 = (ushort *)(ptr + 5);
          ptr = pcVar8;
        }
      }
      else {
        puVar6 = (ushort *)(ptr + 4);
        ptr = pcVar8;
      }
    }
    else {
      puVar6 = (ushort *)(ptr + 3);
    }
    uVar3 = uVar3 & aVar5.data;
    pcVar8 = ptr;
  }
  else {
    puVar6 = (ushort *)(ptr + 2);
    aVar5 = data.field_0;
    pcVar8 = ptr;
  }
  uVar7 = uVar7 & uVar3;
LAB_00159500:
  if (puVar6 == (ushort *)0x0) {
    pcVar8 = Error(msg,pcVar8,ctx_00,(TcFieldData)aVar5,table,hasbits);
    return pcVar8;
  }
  puVar4 = (uint *)RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar4 = -((uint)uVar7 & 1) ^ (uint)(uVar7 >> 1) & 0x7fffffff;
  if (puVar6 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar6;
    if ((uVar2 & 7) == 0) {
      uVar7 = (ulong)(uVar2 & 0xfffffff8);
      pcVar8 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                 (msg,puVar6,ctx,
                                  (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                  table,hasbits);
      return pcVar8;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar4 = *puVar4 | (uint)hasbits;
  }
  return (char *)puVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  // For some reason clang wants to save 5 registers to the stack here,
  // but we only need four for this code, so save the data we don't need
  // to the stack.  Happily, saving them this way uses regular store
  // instructions rather than PUSH/POP, which saves time at the cost of greater
  // code size, but for this heavily-used piece of code, that's fine.
  struct Spill {
    uint64_t field_data;
    ::google::protobuf::MessageLite* msg;
    const ::google::protobuf::internal::TcParseTableBase* table;
    uint64_t hasbits;
  };
  Spill spill = {data.data, msg, table, hasbits};
#if defined(__GNUC__)
  // This empty asm block convinces the compiler that the contents of spill may
  // have changed, and thus can't be cached in registers.  It's similar to, but
  // more optimal than, the effect of declaring it "volatile".
  asm("" : "+m"(spill));
#endif

  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  data.data = spill.field_data;
  msg = spill.msg;
  table = spill.table;
  hasbits = spill.hasbits;

  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}